

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_epoch(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint c;
  longlong local_30;
  longlong epoch;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  epoch = Pig::cursor(pig);
  local_30 = 0;
  bVar1 = Pig::getDigits((Pig *)checkpoint,&local_30);
  if (bVar1) {
    c = Pig::peek((Pig *)checkpoint);
    bVar1 = unicodeLatinAlpha(c);
    if (((!bVar1) && (0x12cea5ff < local_30)) && (local_30 < 0x3afff4255f)) {
      this->_date = local_30;
      return true;
    }
  }
  Pig::restoreTo((Pig *)checkpoint,epoch);
  return false;
}

Assistant:

bool Datetime::parse_epoch (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  long long epoch {};
  if (pig.getDigits (epoch)             &&
      ! unicodeLatinAlpha (pig.peek ()) &&
      epoch >= EPOCH_MIN_VALUE          &&
      epoch < EPOCH_MAX_VALUE)
  {
    _date = static_cast <time_t> (epoch);
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}